

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exact.cpp
# Opt level: O0

double __thiscall libDAI::Exact::run(Exact *this)

{
  long lVar1;
  ostream *poVar2;
  long *plVar3;
  ulong uVar4;
  TFactor<double> *pTVar5;
  TFactor<double> *in_RDI;
  double dVar6;
  size_t I_1;
  size_t i;
  double Z;
  size_t I;
  Factor P;
  TFactor<double> *in_stack_fffffffffffffdb8;
  TFactor<double> *in_stack_fffffffffffffdc0;
  Var *in_stack_fffffffffffffdc8;
  TFactor<double> *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdf0;
  NormType norm;
  TFactor<double> *in_stack_fffffffffffffdf8;
  TFactor<double> *in_stack_fffffffffffffe18;
  TFactor<double> *in_stack_fffffffffffffe20;
  VarSet *in_stack_fffffffffffffe60;
  size_type local_120;
  size_type local_88;
  ulong local_78;
  string local_28 [40];
  
  lVar1 = (*(code *)(in_RDI->_vs)._vars.
                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start[3]._label)();
  if (lVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Starting ");
    (**(code **)((long)((in_RDI->_vs)._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start + 4) + 8))();
    in_stack_fffffffffffffe60 = (VarSet *)std::operator<<(poVar2,local_28);
    std::operator<<((ostream *)in_stack_fffffffffffffe60,"...");
    std::__cxx11::string::~string(local_28);
  }
  TFactor<double>::TFactor(in_stack_fffffffffffffdd0);
  local_78 = 0;
  while( true ) {
    plVar3 = (long *)(**(code **)((long)((in_RDI->_vs)._vars.
                                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2) + 8))();
    uVar4 = (**(code **)(*plVar3 + 0x48))();
    if (uVar4 <= local_78) break;
    plVar3 = (long *)(**(code **)((long)((in_RDI->_vs)._vars.
                                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2) + 8))();
    (**(code **)(*plVar3 + 0x50))(plVar3,local_78);
    TFactor<double>::operator*=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_78 = local_78 + 1;
  }
  dVar6 = TFactor<double>::totalSum((TFactor<double> *)0xb37bd3);
  dVar6 = log(dVar6);
  std::complex<double>::operator=((complex<double> *)(in_RDI + 6),dVar6);
  local_88 = 0;
  while( true ) {
    plVar3 = (long *)(**(code **)((long)((in_RDI->_vs)._vars.
                                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2) + 8))();
    uVar4 = (**(code **)(*plVar3 + 0x28))();
    if (uVar4 <= local_88) break;
    plVar3 = (long *)(**(code **)((long)((in_RDI->_vs)._vars.
                                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2) + 8))();
    in_stack_fffffffffffffdf8 = (TFactor<double> *)(**(code **)(*plVar3 + 0x30))(plVar3,local_88);
    VarSet::VarSet(&in_stack_fffffffffffffdd0->_vs,in_stack_fffffffffffffdc8);
    TFactor<double>::partSum(in_RDI,in_stack_fffffffffffffe60);
    TFactor<double>::normalized
              (in_stack_fffffffffffffdf8,(NormType)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               &in_RDI[5]._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                _M_impl.super__Vector_impl_data._M_finish,local_88);
    TFactor<double>::operator=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    TFactor<double>::~TFactor(in_stack_fffffffffffffdc0);
    TFactor<double>::~TFactor(in_stack_fffffffffffffdc0);
    VarSet::~VarSet((VarSet *)0xb37d3d);
    local_88 = local_88 + 1;
  }
  local_120 = 0;
  while( true ) {
    plVar3 = (long *)(**(code **)((long)((in_RDI->_vs)._vars.
                                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2) + 8))();
    uVar4 = (**(code **)(*plVar3 + 0x48))();
    norm = (NormType)((ulong)plVar3 >> 0x20);
    if (uVar4 <= local_120) break;
    plVar3 = (long *)(**(code **)((long)((in_RDI->_vs)._vars.
                                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2) + 8))();
    pTVar5 = (TFactor<double> *)(**(code **)(*plVar3 + 0x50))(plVar3,local_120);
    TFactor<double>::vars(pTVar5);
    TFactor<double>::partSum(in_RDI,in_stack_fffffffffffffe60);
    TFactor<double>::normalized(in_stack_fffffffffffffdf8,norm);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               &in_RDI[5]._p,local_120);
    TFactor<double>::operator=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    TFactor<double>::~TFactor(in_stack_fffffffffffffdc0);
    TFactor<double>::~TFactor(in_stack_fffffffffffffdc0);
    local_120 = local_120 + 1;
  }
  pTVar5 = (TFactor<double> *)
           (*(code *)(in_RDI->_vs)._vars.
                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                     super__Vector_impl_data._M_start[3]._label)();
  if (pTVar5 != (TFactor<double> *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"finished");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  TFactor<double>::~TFactor(pTVar5);
  return 0.0;
}

Assistant:

double Exact::run() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";

        Factor P;
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            P *= grm().factor(I);

        double Z = P.totalSum();
        _logZ = std::log(Z);
        for( size_t i = 0; i < grm().nrVars(); i++ )
            _beliefsV[i] = P.partSum(grm().var(i)).normalized();
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            _beliefsF[I] = P.partSum(grm().factor(I).vars()).normalized();

        if( Verbose() >= 1 )
            cout << "finished" << endl;

        return 0.0;
    }